

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase56::run(TestCase56 *this)

{
  SourceLocation location;
  bool bVar1;
  int iVar2;
  AsyncIoProvider *pAVar3;
  undefined4 extraout_var;
  undefined8 in_stack_fffffffffffffe00;
  bool local_1c1;
  DebugExpression<const_char_(&)[4]> DStack_1c0;
  bool _kj_shouldLog;
  undefined1 local_1b8 [8];
  DebugComparison<const_char_(&)[4],_kj::String_&> _kjCondition;
  SourceLocation local_188;
  undefined1 *local_170;
  AsyncIoStream **local_168;
  undefined1 *local_160;
  AsyncIoStream **local_158;
  undefined1 *local_150;
  StringPtr local_148;
  undefined1 local_138 [8];
  undefined1 local_130 [8];
  Type local_128;
  Promise<unsigned_long> local_120;
  undefined1 local_118 [8];
  String result;
  Promise<unsigned_int> local_e0;
  Type local_d8;
  Promise<void> local_d0 [2];
  SourceLocation local_c0;
  undefined1 local_a8 [8];
  PromiseFulfillerPair<unsigned_int> port;
  undefined1 local_88 [4];
  char receiveBuffer [4];
  Own<kj::AsyncIoStream,_std::nullptr_t> client;
  Own<kj::AsyncIoStream,_std::nullptr_t> server;
  Own<kj::ConnectionReceiver,_std::nullptr_t> listener;
  Network *network;
  AsyncIoContext ioContext;
  TestCase56 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  setupAsyncIo();
  pAVar3 = Own<kj::AsyncIoProvider,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)&ioContext.lowLevelProvider.ptr);
  iVar2 = (*pAVar3->_vptr_AsyncIoProvider[3])();
  Own<kj::ConnectionReceiver,_std::nullptr_t>::Own
            ((Own<kj::ConnectionReceiver,_std::nullptr_t> *)&server.ptr);
  Own<kj::AsyncIoStream,_std::nullptr_t>::Own((Own<kj::AsyncIoStream,_std::nullptr_t> *)&client.ptr)
  ;
  Own<kj::AsyncIoStream,_std::nullptr_t>::Own((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_88);
  port.fulfiller.ptr._4_4_ = 0;
  SourceLocation::SourceLocation
            (&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x42,0xf);
  location.function = (char *)local_c0._16_8_;
  location.fileName = local_c0.function;
  location.lineNumber = (int)in_stack_fffffffffffffe00;
  location.columnNumber = (int)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  newPromiseAndFulfiller<unsigned_int>(location);
  Promise<unsigned_int>::then<kj::(anonymous_namespace)::TestCase56::run()::__0>
            (&local_e0,(Type *)local_a8);
  Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>::
  then<kj::(anonymous_namespace)::TestCase56::run()::__1>
            ((Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>> *)&local_d8,(Type *)&local_e0);
  Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>::
  then<kj::(anonymous_namespace)::TestCase56::run()::__2>
            ((Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>> *)local_d0,&local_d8);
  Promise<void>::detach<kj::(anonymous_namespace)::TestCase56::run()::__3>
            (local_d0,(Type *)((long)&result.content.disposer + 7));
  Promise<void>::~Promise(local_d0);
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_d8);
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~Promise
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)&local_e0);
  StringPtr::StringPtr(&local_148,"*");
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar2))
            (local_138,(undefined8 *)CONCAT44(extraout_var,iVar2),local_148.content.ptr,
             local_148.content.size_,0);
  local_158 = &server.ptr;
  local_150 = local_a8;
  Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>::
  then<kj::(anonymous_namespace)::TestCase56::run()::__4>
            ((Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>> *)local_130,(Type *)local_138);
  local_168 = &client.ptr;
  local_160 = (undefined1 *)((long)&port.fulfiller.ptr + 4);
  Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>::
  then<kj::(anonymous_namespace)::TestCase56::run()::__5>
            ((Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>> *)&local_128,(Type *)local_130);
  local_170 = (undefined1 *)((long)&port.fulfiller.ptr + 4);
  Promise<unsigned_long>::then<kj::(anonymous_namespace)::TestCase56::run()::__6>
            (&local_120,&local_128);
  SourceLocation::SourceLocation
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x4f,0x17);
  Promise<kj::String>::wait((Promise<kj::String> *)local_118,&local_120);
  Promise<kj::String>::~Promise((Promise<kj::String> *)&local_120);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_128);
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)local_130);
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~Promise
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)local_138);
  DStack_1c0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x9422c6);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)local_1b8,
             (DebugExpression<char_const(&)[4]> *)&stack0xfffffffffffffe40,(String *)local_118);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b8);
  if (!bVar1) {
    local_1c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c1 != false) {
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x5b,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (result)\", _kjCondition, \"foo\", result"
                 ,(char (*) [37])"failed: expected (\"foo\") == (result)",
                 (DebugComparison<const_char_(&)[4],_kj::String_&> *)local_1b8,
                 (char (*) [4])0x9422c6,(String *)local_118);
      local_1c1 = false;
    }
  }
  String::~String((String *)local_118);
  PromiseFulfillerPair<unsigned_int>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<unsigned_int> *)local_a8);
  Own<kj::AsyncIoStream,_std::nullptr_t>::~Own((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_88);
  Own<kj::AsyncIoStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&client.ptr);
  Own<kj::ConnectionReceiver,_std::nullptr_t>::~Own
            ((Own<kj::ConnectionReceiver,_std::nullptr_t> *)&server.ptr);
  AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&network);
  return;
}

Assistant:

TEST(AsyncIo, SimpleNetwork) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();

  Own<ConnectionReceiver> listener;
  Own<AsyncIoStream> server;
  Own<AsyncIoStream> client;

  char receiveBuffer[4]{};

  auto port = newPromiseAndFulfiller<uint>();

  port.promise.then([&](uint portnum) {
    return network.parseAddress("localhost", portnum);
  }).then([&](Own<NetworkAddress>&& result) {
    return result->connect();
  }).then([&](Own<AsyncIoStream>&& result) {
    client = kj::mv(result);
    return client->write("foo"_kjb);
  }).detach([](kj::Exception&& exception) {
    KJ_FAIL_EXPECT(exception);
  });

  kj::String result = network.parseAddress("*").then([&](Own<NetworkAddress>&& result) {
    listener = result->listen();
    port.fulfiller->fulfill(listener->getPort());
    return listener->accept();
  }).then([&](Own<AsyncIoStream>&& result) {
    server = kj::mv(result);
    return server->tryRead(receiveBuffer, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer, n);
  }).wait(ioContext.waitScope);

  EXPECT_EQ("foo", result);
}